

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void wasm::PostWalker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::scan
               (ReIndexer *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  _func_void_ReIndexer_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_008bab5e:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                    ,0x314,__function);
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) {
LAB_008ba7fb:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
                  ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case IfId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_008bab5e;
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,wasm::Visitor<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,wasm::Visitor<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,void>>::Task,10ul>
                  *)&(self->super_PostWalker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>).
                     super_Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_008ba7e4;
  case LoopId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba3cc;
  case BreakId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_008bab5e;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,wasm::Visitor<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,wasm::Visitor<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,void>>::Task,10ul>
                  *)&(self->super_PostWalker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>).
                     super_Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_008ba01f;
  case SwitchId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitSwitch,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_008bab5e;
    }
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
               (Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar5 = *(long *)(pEVar1 + 4);
    goto joined_r0x008b9dce;
  case CallId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_008bab5e;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_008ba7fb;
        Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
                  ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case CallIndirectId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitCallIndirect,currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_008bab5e;
    }
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 2) <= lVar4 - 2U) goto LAB_008ba7fb;
        Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
                  ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
                   (Expression **)(pEVar1[1].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case LocalGetId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitLocalGet,currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_008bab5e;
    }
    break;
  case LocalSetId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitLocalSet,currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba4ba;
  case GlobalGetId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitGlobalGet,currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_008bab5e;
    }
    break;
  case GlobalSetId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitGlobalSet,currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba3cc;
  case LoadId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitLoad,currp);
    if (pEVar1->_id != LoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_008bab5e;
    }
    pEVar1 = pEVar1 + 3;
    goto LAB_008ba735;
  case StoreId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba483;
  case ConstId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_008bab5e;
    }
    break;
  case UnaryId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba4ba;
  case BinaryId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitBinary,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba715;
  case SelectId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitSelect,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba0ef;
  case DropId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba6ed;
  case ReturnId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitReturn,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_008bab5e;
    }
    goto LAB_008b9dc5;
  case MemorySizeId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitMemorySize,currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_008bab5e;
    }
    break;
  case MemoryGrowId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitMemoryGrow,currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba6ed;
  case NopId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_008bab5e;
    }
    break;
  case UnreachableId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitUnreachable,currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_008bab5e;
    }
    break;
  case AtomicRMWId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitAtomicRMW,currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba559;
  case AtomicCmpxchgId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitAtomicCmpxchg,currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba53f;
  case AtomicWaitId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitAtomicWait,currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_008bab5e;
    }
    goto LAB_008b9c5c;
  case AtomicNotifyId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitAtomicNotify,currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba715;
  case AtomicFenceId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitAtomicFence,currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_008bab5e;
    }
    break;
  case SIMDExtractId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitSIMDExtract,currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba4ba;
  case SIMDReplaceId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitSIMDReplace,currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_008bab5e;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_008ba720;
  case SIMDShuffleId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitSIMDShuffle,currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba693;
  case SIMDTernaryId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitSIMDTernary,currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_008bab5e;
    }
    goto LAB_008b9c5c;
  case SIMDShiftId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitSIMDShift,currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba715;
  case SIMDLoadId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitSIMDLoad,currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba301;
  case SIMDLoadStoreLaneId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_008bab5e;
    }
LAB_008ba483:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_008ba735;
  case MemoryInitId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitMemoryInit,currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_008bab5e;
    }
LAB_008ba53f:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_008ba559;
  case DataDropId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitDataDrop,currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_008bab5e;
    }
    break;
  case MemoryCopyId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitMemoryCopy,currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba0ef;
  case MemoryFillId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitMemoryFill,currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba0ef;
  case PopId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_008bab5e;
    }
    break;
  case RefNullId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitRefNull,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_008bab5e;
    }
    break;
  case RefIsNullId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitRefIsNull,currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba6ed;
  case RefFuncId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitRefFunc,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_008bab5e;
    }
    break;
  case RefEqId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba693;
  case TableGetId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitTableGet,currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba3cc;
  case TableSetId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitTableSet,currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba559;
  case TableSizeId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitTableSize,currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_008bab5e;
    }
    break;
  case TableGrowId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitTableGrow,currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_008bab5e;
    }
LAB_008ba559:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_008ba735;
  case TryId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_008bab5e;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 5) <= lVar4 - 2U) goto LAB_008ba7fb;
        Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
                  ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
                   (Expression **)(pEVar1[4].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
LAB_008ba3cc:
    pEVar1 = pEVar1 + 2;
    goto LAB_008ba735;
  case ThrowId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_008bab5e;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_008ba7fb;
        Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
                  ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RethrowId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitRethrow,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_008bab5e;
    }
    break;
  case TupleMakeId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitTupleMake,currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_008bab5e;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_008ba7fb;
        Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
                  ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case TupleExtractId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitTupleExtract,currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba6ed;
  case I31NewId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitI31New,currp);
    if (pEVar1->_id != I31NewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31New]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba6ed;
  case I31GetId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitI31Get,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba6ed;
  case CallRefId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitCallRef,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_008bab5e;
    }
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_008ba7fb;
        Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
                  ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RefTestId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitRefTest,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba6ed;
  case RefCastId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitRefCast,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba6ed;
  case BrOnId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_008bab5e;
    }
LAB_008ba301:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_008ba735;
  case StructNewId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitStructNew,currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_008bab5e;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_008ba7fb;
        Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
                  ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case StructGetId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitStructGet,currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba4ba;
  case StructSetId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitStructSet,currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba715;
  case ArrayNewId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitArrayNew,currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_008bab5e;
    }
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
LAB_008b9dc5:
    local_38 = pEVar1 + 1;
    lVar5 = *(long *)(pEVar1 + 1);
joined_r0x008b9dce:
    if (lVar5 != 0) {
LAB_008ba01f:
      local_40 = scan;
      SmallVector<wasm::Walker<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,wasm::Visitor<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,wasm::Visitor<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,void>>::Task,10ul>
                  *)&(self->super_PostWalker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>).
                     super_Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    break;
  case ArrayNewSegId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitArrayNewSeg,currp);
    if (pEVar1->_id != ArrayNewSegId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewSeg]";
      goto LAB_008bab5e;
    }
    goto LAB_008b9e6d;
  case ArrayNewFixedId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitArrayNewFixed,currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_008bab5e;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_008ba7fb;
        Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
                  ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ArrayGetId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitArrayGet,currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba693;
  case ArraySetId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitArraySet,currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba0ef;
  case ArrayLenId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitArrayLen,currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba6ed;
  case ArrayCopyId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitArrayCopy,currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_008bab5e;
    }
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_008b9bfe;
  case ArrayFillId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitArrayFill,currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_008bab5e;
    }
LAB_008b9bfe:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    goto LAB_008ba0ef;
  case ArrayInitId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitArrayInit,currp);
    if (pEVar1->_id != ArrayInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInit]";
      goto LAB_008bab5e;
    }
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 4));
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
LAB_008b9e6d:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_008ba735;
  case RefAsId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba4ba;
  case StringNewId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitStringNew,currp);
    if (pEVar1->_id != StringNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_008bab5e;
    }
    local_38 = pEVar1 + 3;
    local_40 = scan;
    if (*(long *)(pEVar1 + 3) != 0) {
      SmallVector<wasm::Walker<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,wasm::Visitor<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,wasm::Visitor<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,void>>::Task,10ul>
                  *)&(self->super_PostWalker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>).
                     super_Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,wasm::Visitor<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,wasm::Visitor<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,void>>::Task,10ul>
                  *)&(self->super_PostWalker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>).
                     super_Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,wasm::Visitor<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,wasm::Visitor<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,void>>::Task,10ul>
                  *)&(self->super_PostWalker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>).
                     super_Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_008ba7e4;
  case StringConstId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitStringConst,currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_008bab5e;
    }
    break;
  case StringMeasureId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitStringMeasure,currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba4ba;
  case StringEncodeId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitStringEncode,currp);
    if (pEVar1->_id != StringEncodeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_008bab5e;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,wasm::Visitor<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,wasm::Visitor<wasm::ReorderLocals::doWalkFunction(wasm::Function*)::ReIndexer,void>>::Task,10ul>
                  *)&(self->super_PostWalker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>).
                     super_Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 2));
    pEVar1 = (Expression *)&pEVar1[1].type;
LAB_008ba7e4:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,(Expression **)pEVar1
              );
    break;
  case StringConcatId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitStringConcat,currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba693;
  case StringEqId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitStringEq,currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba715;
  case StringAsId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitStringAs,currp);
    if (pEVar1->_id != StringAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringAs]";
      goto LAB_008bab5e;
    }
LAB_008ba4ba:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_008ba735;
  case StringWTF8AdvanceId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitStringWTF8Advance,currp);
    if (pEVar1->_id != StringWTF8AdvanceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF8Advance]";
      goto LAB_008bab5e;
    }
LAB_008ba0ef:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 2));
    goto LAB_008ba693;
  case StringWTF16GetId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitStringWTF16Get,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_008bab5e;
    }
    goto LAB_008ba693;
  case StringIterNextId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitStringIterNext,currp);
    if (pEVar1->_id != StringIterNextId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterNext]";
      goto LAB_008bab5e;
    }
LAB_008ba6ed:
    pEVar1 = pEVar1 + 1;
LAB_008ba735:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,(Expression **)pEVar1
              );
    return;
  case StringIterMoveId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitStringIterMove,currp);
    if (pEVar1->_id != StringIterMoveId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterMove]";
      goto LAB_008bab5e;
    }
LAB_008ba715:
    currp_00 = pEVar1 + 2;
LAB_008ba720:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
               (Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_008ba735;
  case StringSliceWTFId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitStringSliceWTF,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_008bab5e;
    }
LAB_008b9c5c:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_008ba720;
  case StringSliceIterId:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,
               Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::doVisitStringSliceIter,currp);
    if (pEVar1->_id != StringSliceIterId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceIter]";
      goto LAB_008bab5e;
    }
LAB_008ba693:
    Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_>::pushTask
              ((Walker<ReIndexer,_wasm::Visitor<ReIndexer,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_008ba735;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }